

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjoint_sets.cpp
# Opt level: O2

size_t __thiscall geometrycentral::MarkedDisjointSets::find(MarkedDisjointSets *this,size_t x)

{
  size_t x_00;
  size_t sVar1;
  
  x_00 = (this->parent).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[x];
  sVar1 = x;
  if (x_00 != x) {
    sVar1 = find(this,x_00);
    (this->parent).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[x] = sVar1;
  }
  return sVar1;
}

Assistant:

size_t MarkedDisjointSets::find(size_t x) {
  if (x != parent[x]) parent[x] = find(parent[x]);
  return parent[x];
}